

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3648a::string::validate
          (string *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e)

{
  ulong uVar1;
  root_schema *prVar2;
  value_t vVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  string *psVar7;
  string *psVar8;
  ostringstream s;
  allocator<char> local_231;
  undefined1 local_230 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [64];
  string local_1a8;
  
  local_230._32_8_ = e;
  if ((this->minLength_).first == true) {
    psVar7 = (string *)instance;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_1a8);
    sVar5 = utf8_length(&local_1a8,psVar7);
    uVar1 = (this->minLength_).second;
    std::__cxx11::string::~string((string *)&local_1a8);
    e = (error_handler *)local_230._32_8_;
    if (sVar5 < uVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar6 = std::operator<<((ostream *)&local_1a8,"instance is too short as per minLength:");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__cxx11::stringbuf::str();
      (*(*&e->_vptr_error_handler)[2])(e,ptr,instance,local_230);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
  }
  if ((this->maxLength_).first == true) {
    psVar7 = (string *)instance;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_1a8);
    sVar5 = utf8_length(&local_1a8,psVar7);
    uVar1 = (this->maxLength_).second;
    std::__cxx11::string::~string((string *)&local_1a8);
    e = (error_handler *)local_230._32_8_;
    if (uVar1 < sVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar6 = std::operator<<((ostream *)&local_1a8,"instance is too long as per maxLength: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__cxx11::stringbuf::str();
      (*(*&e->_vptr_error_handler)[2])(e,ptr,instance,local_230);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
  }
  if ((this->content_).
      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Head_base<0UL,_bool,_false>._M_head_impl == true) {
    prVar2 = (this->super_schema).root_;
    if ((prVar2->content_check_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,
                 "a content checker was not provided but a contentEncoding or contentMediaType for this string have been present: \'"
                 ,&local_231);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1e8 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &(this->content_).
                      super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .
                      super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      ._M_head_impl);
      std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1e8 + 0x20),"\' \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                     &local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->content_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230
                     ,"\'");
      (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)local_230);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
      psVar8 = (string *)local_1e8;
      goto LAB_00119eb1;
    }
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
    ::operator()(&prVar2->content_check_,
                 &(this->content_).
                  super__Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  ._M_head_impl,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->content_,instance);
  }
  else {
    vVar3 = instance->m_type;
    if (vVar3 != binary) goto LAB_00119eb8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"expected string, but get binary data",
               (allocator<char> *)local_230);
    (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1a8);
    psVar8 = &local_1a8;
LAB_00119eb1:
    std::__cxx11::string::~string((string *)psVar8);
  }
  vVar3 = instance->m_type;
LAB_00119eb8:
  if (vVar3 == string) {
    if ((this->pattern_).first == true) {
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_1a8,instance);
      bVar4 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a8,&(this->pattern_).second,0);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (!bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8,"instance does not match regex pattern: ",&this->patternString_);
        (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
    if ((this->format_).first == true) {
      prVar2 = (this->super_schema).root_;
      if ((prVar2->format_check_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_230,
                   "a format checker was not provided but a format keyword for this string is present: "
                   ,(allocator<char> *)&local_208);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_230,&(this->format_).second);
        (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        psVar8 = (string *)local_230;
      }
      else {
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_1a8,instance);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&prVar2->format_check_,&(this->format_).second,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                    );
        psVar8 = &local_1a8;
      }
      std::__cxx11::string::~string((string *)psVar8);
    }
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		if (minLength_.first) {
			if (utf8_length(instance.get<std::string>()) < minLength_.second) {
				std::ostringstream s;
				s << "instance is too short as per minLength:" << minLength_.second;
				e.error(ptr, instance, s.str());
			}
		}

		if (maxLength_.first) {
			if (utf8_length(instance.get<std::string>()) > maxLength_.second) {
				std::ostringstream s;
				s << "instance is too long as per maxLength: " << maxLength_.second;
				e.error(ptr, instance, s.str());
			}
		}

		if (std::get<0>(content_)) {
			if (root_->content_check() == nullptr)
				e.error(ptr, instance, std::string("a content checker was not provided but a contentEncoding or contentMediaType for this string have been present: '") + std::get<1>(content_) + "' '" + std::get<2>(content_) + "'");
			else {
				try {
					root_->content_check()(std::get<1>(content_), std::get<2>(content_), instance);
				} catch (const std::exception &ex) {
					e.error(ptr, instance, std::string("content-checking failed: ") + ex.what());
				}
			}
		} else if (instance.type() == json::value_t::binary) {
			e.error(ptr, instance, "expected string, but get binary data");
		}

		if (instance.type() != json::value_t::string) {
			return; // next checks only for strings
		}

#ifndef NO_STD_REGEX
		if (pattern_.first &&
		    !REGEX_NAMESPACE::regex_search(instance.get<std::string>(), pattern_.second))
			e.error(ptr, instance, "instance does not match regex pattern: " + patternString_);
#endif

		if (format_.first) {
			if (root_->format_check() == nullptr)
				e.error(ptr, instance, std::string("a format checker was not provided but a format keyword for this string is present: ") + format_.second);
			else {
				try {
					root_->format_check()(format_.second, instance.get<std::string>());
				} catch (const std::exception &ex) {
					e.error(ptr, instance, std::string("format-checking failed: ") + ex.what());
				}
			}
		}
	}